

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.h
# Opt level: O2

void fy_advance(fy_parser *fyp,int c)

{
  int iVar1;
  _Bool _Var2;
  int iVar3;
  size_t sStack_20;
  
  if (c < 0x80) {
    sStack_20 = 1;
  }
  else if ((uint)c < 0x800) {
    sStack_20 = 2;
  }
  else {
    sStack_20 = 4 - (ulong)((uint)c < 0x10000);
  }
  fy_advance_octets(fyp,sStack_20);
  if ((c == 0xd) && (iVar3 = fy_parse_peek(fyp), iVar3 == 10)) {
    fy_advance_octets(fyp,1);
  }
  else {
    _Var2 = fyp_is_lb(fyp,c);
    if (!_Var2) {
      iVar3 = fyp->column;
      iVar1 = fyp->tabsize;
      if (c == 9 && iVar1 != 0) {
        iVar3 = (iVar3 + iVar1) - iVar3 % iVar1;
      }
      else {
        iVar3 = iVar3 + 1;
      }
      fyp->column = iVar3;
      fyp->nontab_column = fyp->nontab_column + 1;
      return;
    }
  }
  fyp->column = 0;
  fyp->nontab_column = 0;
  fyp->line = fyp->line + 1;
  return;
}

Assistant:

static inline void fy_advance(struct fy_parser *fyp, int c) {
    bool is_line_break = false;

    /* skip this character */
    fy_advance_octets(fyp, fy_utf8_width(c));

    /* first check for CR/LF */
    if (c == '\r' && fy_parse_peek(fyp) == '\n') {
        fy_advance_octets(fyp, 1);
        is_line_break = true;
    } else if (fyp_is_lb(fyp, c))
        is_line_break = true;

    if (is_line_break) {
        fyp->column = 0;
        fyp->nontab_column = 0;
        fyp->line++;
    } else if (fyp->tabsize && fy_is_tab(c)) {
        fyp->column += (fyp->tabsize - (fyp->column % fyp->tabsize));
        fyp->nontab_column++;
    } else {
        fyp->column++;
        fyp->nontab_column++;
    }
}